

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_AllReduceVec_Test::TestBody(MxxReduce_AllReduceVec_Test *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  char *pcVar5;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_4;
  int i_2;
  Message local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_3;
  Message local_180;
  comm local_178;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_138 [4];
  int mysize;
  vector<int,_std::allocator<int>_> local_110;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  int i_1;
  Message local_c0;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> w;
  int i;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> v;
  undefined1 local_30 [4];
  int n;
  comm c;
  MxxReduce_AllReduceVec_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)local_30);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _4_4_ = 10;
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,10,&local_51);
  std::allocator<int>::~allocator(&local_51);
  for (w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      iVar2 = (int)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage,
      (int)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage <
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_;
      w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,
                        (long)(int)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    *pvVar3 = iVar2;
  }
  mxx::comm::comm((comm *)&gtest_ar.message_);
  mxx::allreduce<int>((vector<int,_std::allocator<int>_> *)local_80,
                      (vector<int,_std::allocator<int>_> *)local_50,(comm *)&gtest_ar.message_);
  mxx::comm::~comm((comm *)&gtest_ar.message_);
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_80);
  local_b4 = (int)sVar4;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_b0,"n","(int)w.size()",
             (int *)((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0xc4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
    testing::Message::~Message(&local_c0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    for (gtest_ar_1.message_.ptr_._0_4_ = 0;
        (int)gtest_ar_1.message_.ptr_ <
        v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; gtest_ar_1.message_.ptr_._0_4_ = (int)gtest_ar_1.message_.ptr_ + 1)
    {
      local_e4 = mxx::comm::size((comm *)local_30);
      local_e4 = local_e4 * (int)gtest_ar_1.message_.ptr_;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_80,
                          (long)(int)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_e0,"c.size()*i","w[i]",&local_e4,pvVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0xc6,pcVar5);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::Message::~Message(&local_f0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0011794e;
    }
    iVar2 = mxx::comm::rank((comm *)local_30);
    mxx::comm::split((comm *)local_138,(comm *)local_30,iVar2 % 2);
    mxx::allreduce<int,MxxReduce_AllReduceVec_Test::TestBody()::__0>
              (&local_110,(mxx *)local_50,local_138);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_80,&local_110);
    std::vector<int,_std::allocator<int>_>::~vector(&local_110);
    mxx::comm::~comm((comm *)local_138);
    iVar2 = mxx::comm::size((comm *)local_30);
    gtest_ar_2.message_.ptr_._4_4_ = iVar2 / 2;
    iVar2 = mxx::comm::size((comm *)local_30);
    if ((iVar2 % 2 == 1) && (iVar2 = mxx::comm::rank((comm *)local_30), iVar2 % 2 == 0)) {
      gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1;
    }
    iVar2 = mxx::comm::rank((comm *)local_30);
    mxx::comm::split(&local_178,(comm *)local_30,iVar2 % 2);
    local_154 = mxx::comm::size(&local_178);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_150,"mysize","c.split(c.rank() % 2).size()",
               (int *)((long)&gtest_ar_2.message_.ptr_ + 4),&local_154);
    mxx::comm::~comm(&local_178);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0xcd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_180);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_180);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_80);
      local_19c = (int)sVar4;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_198,"n","(int)w.size()",
                 (int *)((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4),&local_19c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe50,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0xce,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe50,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
        testing::Message::~Message(&local_1a8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        for (gtest_ar_4.message_.ptr_._4_4_ = 0;
            gtest_ar_4.message_.ptr_._4_4_ <
            v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_;
            gtest_ar_4.message_.ptr_._4_4_ = gtest_ar_4.message_.ptr_._4_4_ + 1) {
          local_1cc = gtest_ar_2.message_.ptr_._4_4_ * gtest_ar_4.message_.ptr_._4_4_;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_80,
                              (long)gtest_ar_4.message_.ptr_._4_4_);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_1c8,"mysize*i","w[i]",&local_1cc,pvVar3);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
          if (!bVar1) {
            testing::Message::Message(&local_1d8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1e0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                       ,0xd0,pcVar5);
            testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
            testing::internal::AssertHelper::~AssertHelper(&local_1e0);
            testing::Message::~Message(&local_1d8);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
          if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0011794e;
        }
        gtest_ar_1.message_.ptr_._4_4_ = 0;
      }
    }
  }
LAB_0011794e:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  mxx::comm::~comm((comm *)local_30);
  return;
}

Assistant:

TEST(MxxReduce, AllReduceVec) {
    mxx::comm c;

    int n = 10; // numbers per rank

    std::vector<int> v(n);
    for (int i = 0; i < n; ++i) {
        v[i] = i;
    }

    std::vector<int> w = mxx::allreduce(v);
    ASSERT_EQ(n, (int)w.size());
    for (int i = 0; i < n; ++i) {
        ASSERT_EQ(c.size()*i, w[i]);
    }

    w = mxx::allreduce(v, [](int x, int y) { return x+y; }, c.split(c.rank() % 2));
    int mysize = c.size() / 2;
    if (c.size() % 2 == 1 && c.rank() % 2 == 0)
        ++mysize;
    ASSERT_EQ(mysize, c.split(c.rank() % 2).size());
    ASSERT_EQ(n, (int)w.size());
    for (int i = 0; i < n; ++i) {
        ASSERT_EQ(mysize*i, w[i]);
    }
}